

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_TryGetPropertyInt64(JSContext *ctx,JSValue obj,int64_t idx,JSValue *pval)

{
  JSValue prop_00;
  JSValue this_obj;
  JSValue obj_00;
  int iVar1;
  int iVar2;
  JSAtom JVar3;
  ulong in_RCX;
  JSContext *in_RDX;
  undefined8 in_RSI;
  JSValueUnion *in_R8;
  JSValue JVar4;
  int present;
  JSAtom prop;
  JSValue val;
  undefined1 in_stack_00000088 [16];
  undefined1 in_stack_00000098 [16];
  BOOL in_stack_00000120;
  JSAtom in_stack_ffffffffffffff2c;
  JSContext *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff60 [16];
  undefined4 in_stack_ffffffffffffff74;
  uint32_t v;
  undefined4 uVar5;
  JSAtom prop_01;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int64_t in_stack_ffffffffffffffb8;
  JSValueUnion local_30;
  void *local_28;
  
  prop_01 = (JSAtom)((ulong)in_RSI >> 0x20);
  v = (uint32_t)in_RCX;
  uVar5 = (undefined4)(in_RCX >> 0x20);
  local_30.float64 = 0.0;
  local_28 = (void *)0x3;
  if (in_RCX < 0x80000000) {
    __JS_AtomFromUInt32(v);
    obj_00.u._4_4_ = in_stack_ffffffffffffffb4;
    obj_00.u.int32 = in_stack_ffffffffffffffb0;
    obj_00.tag = in_stack_ffffffffffffffb8;
    iVar1 = JS_HasProperty(in_RDX,obj_00,prop_01);
    if (0 < iVar1) {
      this_obj.tag._0_4_ = v;
      this_obj.u.ptr = in_R8;
      this_obj.tag._4_4_ = uVar5;
      prop_00.tag = (int64_t)local_28;
      prop_00.u.float64 = local_30.float64;
      JVar4 = JS_GetPropertyValue((JSContext *)CONCAT44(in_stack_ffffffffffffff74,iVar1),this_obj,
                                  prop_00);
      local_30 = JVar4.u;
      local_28 = (void *)JVar4.tag;
      iVar2 = JS_IsException(JVar4);
      if (iVar2 != 0) {
        iVar1 = -1;
      }
    }
  }
  else {
    JVar3 = JS_NewAtomInt64(in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._0_8_);
    iVar1 = -1;
    if (JVar3 != 0) {
      JVar4.u._4_4_ = in_stack_ffffffffffffffb4;
      JVar4.u.int32 = in_stack_ffffffffffffffb0;
      JVar4.tag = in_stack_ffffffffffffffb8;
      iVar1 = JS_HasProperty(in_RDX,JVar4,prop_01);
      if (0 < iVar1) {
        JVar4 = JS_GetPropertyInternal
                          ((JSContext *)obj.tag,(JSValue)in_stack_00000098,obj.u._4_4_,
                           (JSValue)in_stack_00000088,in_stack_00000120);
        local_30 = JVar4.u;
        local_28 = (void *)JVar4.tag;
        iVar2 = JS_IsException(JVar4);
        if (iVar2 != 0) {
          iVar1 = -1;
        }
      }
      JS_FreeAtom(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    }
  }
  in_R8->ptr = (void *)local_30;
  in_R8[1].ptr = local_28;
  return iVar1;
}

Assistant:

static int JS_TryGetPropertyInt64(JSContext *ctx, JSValueConst obj, int64_t idx, JSValue *pval)
{
    JSValue val = JS_UNDEFINED;
    JSAtom prop;
    int present;

    if (likely((uint64_t)idx <= JS_ATOM_MAX_INT)) {
        /* fast path */
        present = JS_HasProperty(ctx, obj, __JS_AtomFromUInt32(idx));
        if (present > 0) {
            val = JS_GetPropertyValue(ctx, obj, JS_NewInt32(ctx, idx));
            if (unlikely(JS_IsException(val)))
                present = -1;
        }
    } else {
        prop = JS_NewAtomInt64(ctx, idx);
        present = -1;
        if (likely(prop != JS_ATOM_NULL)) {
            present = JS_HasProperty(ctx, obj, prop);
            if (present > 0) {
                val = JS_GetProperty(ctx, obj, prop);
                if (unlikely(JS_IsException(val)))
                    present = -1;
            }
            JS_FreeAtom(ctx, prop);
        }
    }
    *pval = val;
    return present;
}